

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImU32 col;
  ImVec2 *pIVar7;
  uint uVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  undefined8 extraout_XMM0_Qb;
  
  local_60 = *pos_min;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_display_end == text) {
      IVar9 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar10._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_display_end,
                      (char **)0x0);
      auVar10._8_8_ = extraout_XMM0_Qb;
      auVar11._4_12_ = auVar10._4_12_;
      auVar11._0_4_ = (float)(int)(auVar10._0_4_ + 0.99999);
      IVar9 = auVar11._0_8_;
    }
  }
  else {
    IVar9 = *text_size_if_known;
  }
  if (clip_rect != (ImRect *)0x0) {
    pos_min = &clip_rect->Min;
  }
  pIVar7 = &clip_rect->Max;
  if (clip_rect == (ImRect *)0x0) {
    pIVar7 = pos_max;
  }
  bVar1 = true;
  if (local_60.x + IVar9.x < pIVar7->x) {
    bVar1 = pIVar7->y <= local_60.y + IVar9.y;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar2 = true;
    if ((((ImRect *)pos_min)->Min).x <= local_60.x) {
      bVar2 = local_60.y < (((ImRect *)pos_min)->Min).y;
    }
    bVar1 = (bool)(bVar1 | bVar2);
  }
  if (0.0 < align->x) {
    fVar12 = ((pos_max->x - local_60.x) - IVar9.x) * align->x + local_60.x;
    uVar8 = -(uint)(fVar12 <= local_60.x);
    local_60.x = (float)(uVar8 & (uint)local_60.x | ~uVar8 & (uint)fVar12);
  }
  if (0.0 < align->y) {
    fVar12 = ((pos_max->y - local_60.y) - IVar9.y) * align->y + local_60.y;
    uVar8 = -(uint)(fVar12 <= local_60.y);
    local_60.y = (float)(uVar8 & (uint)local_60.y | ~uVar8 & (uint)fVar12);
  }
  if (bVar1) {
    local_34 = pIVar7->y;
    local_40 = ((ImRect *)pos_min)->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar3 = (GImGui->Style).Colors[0].z;
    uVar4 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar4;
    local_58.z = (float)uVar3;
    local_38 = pIVar7->x;
    col = ColorConvertFloat4ToU32(&local_58);
  }
  else {
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar6;
    local_58.z = (float)uVar5;
    col = ColorConvertFloat4ToU32(&local_58);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&local_60,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}